

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,ListEditQual v)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "";
    pcVar2 = "";
    break;
  case 1:
    pcVar2 = "append";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "add";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "delete";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "prepend";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "order";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "[[Invalid ListEditQual value]]";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::ListEditQual v) {
  if (v == tinyusdz::ListEditQual::ResetToExplicit) {
    return "";  // unqualified
  } else if (v == tinyusdz::ListEditQual::Append) {
    return "append";
  } else if (v == tinyusdz::ListEditQual::Add) {
    return "add";
  } else if (v == tinyusdz::ListEditQual::Delete) {
    return "delete";
  } else if (v == tinyusdz::ListEditQual::Prepend) {
    return "prepend";
  } else if (v == tinyusdz::ListEditQual::Order) {
    return "order";
  }

  return "[[Invalid ListEditQual value]]";
}